

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O2

void __thiscall JUnitTestOutput::writeTestCases(JUnitTestOutput *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  JUnitTestCaseResultNode *this_00;
  SimpleString local_40;
  SimpleString buf;
  
  this_00 = (this->impl_->results_).head_;
  while (this_00 != (JUnitTestCaseResultNode *)0x0) {
    pcVar2 = SimpleString::asCharString(&this->impl_->package_);
    bVar1 = SimpleString::isEmpty(&this->impl_->package_);
    pcVar5 = ".";
    if (bVar1) {
      pcVar5 = "";
    }
    pcVar3 = SimpleString::asCharString(&(this->impl_->results_).group_);
    pcVar4 = SimpleString::asCharString(&this_00->name_);
    StringFromFormat((char *)&buf,"<testcase classname=\"%s%s%s\" name=\"%s\" time=\"%d.%03d\">\n",
                     pcVar2,pcVar5,pcVar3,pcVar4,this_00->execTime_ / 1000,this_00->execTime_ % 1000
                    );
    pcVar2 = SimpleString::asCharString(&buf);
    SimpleString::SimpleString(&local_40,pcVar2);
    (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&local_40);
    SimpleString::~SimpleString(&local_40);
    if (this_00->failure_ == (TestFailure *)0x0) {
      if (this_00->ignored_ == true) {
        SimpleString::SimpleString(&local_40,"<skipped />\n");
        (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&local_40);
        SimpleString::~SimpleString(&local_40);
      }
    }
    else {
      (*(this->super_TestOutput)._vptr_TestOutput[0x1e])(this,this_00);
    }
    SimpleString::SimpleString(&local_40,"</testcase>\n");
    (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&local_40);
    SimpleString::~SimpleString(&local_40);
    this_00 = this_00->next_;
    SimpleString::~SimpleString(&buf);
  }
  return;
}

Assistant:

void JUnitTestOutput::writeTestCases()
{
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        SimpleString buf = StringFromFormat(
                "<testcase classname=\"%s%s%s\" name=\"%s\" time=\"%d.%03d\">\n",
                impl_->package_.asCharString(),
                impl_->package_.isEmpty() == true ? "" : ".",
                impl_->results_.group_.asCharString(),
                cur->name_.asCharString(), (int) (cur->execTime_ / 1000), (int)(cur->execTime_ % 1000));
        writeToFile(buf.asCharString());

        if (cur->failure_) {
            writeFailure(cur);
        }
        else if (cur->ignored_) {
            writeToFile("<skipped />\n");
        }
        writeToFile("</testcase>\n");
        cur = cur->next_;
    }
}